

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void Utils::printMacAddr(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int pos)

{
  ostream *poVar1;
  reference pvVar2;
  int pos_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 10));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,":");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xb));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,":");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xc));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,":");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xd));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,":");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xe));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1,":");
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xf));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Utils::printMacAddr(std::vector<unsigned int> vec, int pos) {
    cout << hex << vec[pos+10] <<  ":" << vec[pos+11] << ":" << vec[pos+12] << ":"
        << vec[pos+13] << ":" << vec[pos+14]  << ":" << vec[pos+15] << endl;
}